

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D_x86_avx2::create_pipeline(Convolution1D_x86_avx2 *this,Option *opt)

{
  uint uVar1;
  int iVar2;
  _func_int *p_Var3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  int _h;
  undefined4 *puVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  undefined4 *puVar20;
  long lVar21;
  Mat weight_data_r2;
  Mat local_78;
  
  p_Var3 = this->_vptr_Convolution1D_x86_avx2[-3];
  if (*(int *)(&this->field_0x140 + (long)p_Var3) == 0) {
    uVar1 = *(uint *)(&this->field_0xd0 + (long)p_Var3);
    uVar19 = (long)*(int *)(&this->field_0xf0 + (long)p_Var3) /
             (long)*(int *)(&this->field_0xd4 + (long)p_Var3);
    uVar13 = (long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff) /
             (long)(int)uVar1;
    _h = (int)uVar13;
    uVar19 = 1;
    uVar12 = 1;
    if (opt->use_packing_layout == true) {
      uVar19 = (ulong)((uVar13 & 3) == 0) * 3 + 1;
      if ((uVar13 & 7) == 0) {
        uVar19 = 8;
      }
      uVar12 = (ulong)((uVar1 & 3) == 0) * 3 + 1;
      if ((uVar1 & 7) == 0) {
        uVar12 = 8;
      }
    }
    p_Var3 = this->_vptr_Convolution1D_x86_avx2[-3];
    Mat::reshape(&local_78,(Mat *)(&this->field_0x148 + (long)p_Var3),
                 *(int *)(&this->field_0xd4 + (long)p_Var3),_h,
                 *(int *)(&this->field_0xd0 + (long)p_Var3),(Allocator *)0x0);
    iVar18 = (int)uVar19;
    iVar11 = (int)uVar12;
    Mat::create(&this->weight_data_packed,
                *(int *)(&this->field_0xd4 + (long)this->_vptr_Convolution1D_x86_avx2[-3]),
                (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar13 & 0xffffffff) / (long)iVar18
                     ),*(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx2[-3]) /
                       iVar11,(ulong)(uint)(iVar11 * iVar18 * 4),iVar11 * iVar18,(Allocator *)0x0);
    pp_Var4 = this->_vptr_Convolution1D_x86_avx2;
    if (iVar11 <= *(int *)(&this->field_0xd0 + (long)pp_Var4[-3])) {
      pp_Var5 = this->_vptr_Convolution1D_x86_avx2;
      pvVar6 = (this->weight_data_packed).data;
      sVar7 = (this->weight_data_packed).elemsize;
      iVar2 = (this->weight_data_packed).w;
      sVar8 = (this->weight_data_packed).cstep;
      uVar13 = 0;
      do {
        if (iVar18 <= _h) {
          uVar16 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var5[-3])) {
              puVar9 = (undefined4 *)
                       ((long)pvVar6 +
                       (long)(int)((uVar16 & 0xffffffff) / uVar19) * (long)iVar2 * sVar7 +
                       (long)(int)((uVar13 & 0xffffffff) / uVar12) * sVar8 * sVar7);
              lVar10 = 0;
              lVar21 = 0;
              do {
                uVar15 = 0;
                uVar14 = uVar16;
                do {
                  puVar20 = (undefined4 *)
                            ((long)local_78.data +
                            ((long)local_78.w * uVar14 + uVar13 * local_78.cstep) *
                            local_78.elemsize + lVar10);
                  uVar17 = uVar12;
                  do {
                    *puVar9 = *puVar20;
                    puVar9 = puVar9 + 1;
                    puVar20 = (undefined4 *)((long)puVar20 + local_78.cstep * local_78.elemsize);
                    uVar17 = uVar17 - 1;
                  } while (uVar17 != 0);
                  uVar15 = uVar15 + 1;
                  uVar14 = uVar14 + 1;
                } while (uVar15 != uVar19);
                lVar21 = lVar21 + 1;
                lVar10 = lVar10 + 4;
              } while (lVar21 < *(int *)(&this->field_0xd4 + (long)pp_Var5[-3]));
            }
            uVar16 = uVar16 + uVar19;
          } while ((long)uVar16 < (long)((long)_h - (ulong)(iVar18 - 1)));
        }
        uVar13 = uVar13 + uVar12;
      } while ((long)((iVar11 - 1) + uVar13) < (long)*(int *)(&this->field_0xd0 + (long)pp_Var4[-3])
              );
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return 0;
}

Assistant:

int Convolution1D_x86_avx2::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-inch-outch
    // dst = pb-pa-kw-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(kernel_w, num_input, num_output);

        weight_data_packed.create(kernel_w, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            Mat g0 = weight_data_packed.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                float* g00 = g0.row(p / elempack);

                for (int k = 0; k < kernel_w; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    return 0;
}